

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Compress *compression)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(*compression) {
  case Zip:
    __s = "zip";
    __a = &local_a;
    break;
  case Gzip:
    __s = "gzip";
    __a = &local_b;
    break;
  case Bzip2:
    __s = "bzip2";
    __a = &local_c;
    break;
  case Xz:
    __s = "xz";
    __a = &local_d;
    break;
  default:
    __s = "none";
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Compress& compression)
{
    switch (compression)
    {
    default:
    case Compress::None:    return "none";
    case Compress::Zip:     return "zip";
    case Compress::Gzip:    return "gzip";
    case Compress::Bzip2:   return "bzip2";
    case Compress::Xz:      return "xz";
    }
}